

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetInteger64Verifier::verifyFloatRange
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLfloat min,GLfloat max)

{
  ostringstream *this_00;
  bool bVar1;
  float fVar2;
  float fVar3;
  StateQueryMemoryWriteGuard<long[2]> range;
  undefined1 local_1a8 [384];
  
  fVar2 = floorf(min + 0.5);
  fVar3 = ceilf(max + -0.5);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[2]>::StateQueryMemoryWriteGuard(&range)
  ;
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,range.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[2]>::verifyValidity
                    (&range,testCtx);
  if ((bVar1) && (((long)fVar2 < range.m_value[0] || (range.m_value[1] < (long)fVar3)))) {
    local_1a8._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"// ERROR: range [");
    std::ostream::_M_insert<long>((long)this_00);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::_M_insert<long>((long)this_00);
    std::operator<<((ostream *)this_00,"]");
    std::operator<<((ostream *)this_00," is not in range [");
    std::ostream::_M_insert<long>((long)this_00);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::_M_insert<long>((long)this_00);
    std::operator<<((ostream *)this_00,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer range");
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyFloatRange (tcu::TestContext& testCtx, GLenum name, GLfloat min, GLfloat max)
{
	using tcu::TestLog;

	const GLint64 testRangeAsGLint[] =
	{
		StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<GLint64>(min),
		StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<GLint64>(max)
	};

	StateQueryMemoryWriteGuard<GLint64[2]> range;
	glGetInteger64v(name, range);

	if (!range.verifyValidity(testCtx))
		return;

	// check if test range outside of gl state range
	if (testRangeAsGLint[0] < range[0] ||
		testRangeAsGLint[1] > range[1])
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: range ["
			<< testRangeAsGLint[0] << ", "
			<< testRangeAsGLint[1] << "]"
			<< " is not in range ["
			<< range[0] << ", "
			<< range[1] << "]" << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer range");
	}
}